

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
emplace_helper<QGuiApplicationPrivate::SynthesizedMouseData>
          (QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *this,QWindow **key,
          SynthesizedMouseData *args)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  QObject *pQVar4;
  piter pVar5;
  Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>>::
  findOrInsert<QWindow*>
            ((InsertionResult *)local_38,
             (Data<QHashPrivate::Node<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>> *)
             this->d,key);
  this_00 = (Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    this_00->key = *key;
    qVar1 = (args->pos).yp;
    qVar2 = (args->screenPos).xp;
    qVar3 = (args->screenPos).yp;
    (this_00->value).pos.xp = (args->pos).xp;
    (this_00->value).pos.yp = qVar1;
    (this_00->value).screenPos.xp = qVar2;
    (this_00->value).screenPos.yp = qVar3;
    pQVar4 = (args->window).wp.value;
    (this_00->value).window.wp.d = (args->window).wp.d;
    (this_00->value).window.wp.value = pQVar4;
    (args->window).wp.d = (Data *)0x0;
    (args->window).wp.value = (QObject *)0x0;
  }
  else {
    QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
    emplaceValue<QGuiApplicationPrivate::SynthesizedMouseData>(this_00,args);
  }
  pVar5.bucket = local_38._8_8_;
  pVar5.d = (Data<QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar5;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }